

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

string * __thiscall
google::protobuf::MessageLite::SerializePartialAsString_abi_cxx11_(MessageLite *this)

{
  bool bVar1;
  string *in_RDI;
  string *output;
  string *in_stack_00000050;
  MessageLite *in_stack_00000058;
  
  std::__cxx11::string::string((string *)in_RDI);
  bVar1 = AppendPartialToString(in_stack_00000058,in_stack_00000050);
  if (!bVar1) {
    std::__cxx11::string::clear();
  }
  return in_RDI;
}

Assistant:

std::string MessageLite::SerializePartialAsString() const {
  std::string output;
  if (!AppendPartialToString(&output)) output.clear();
  return output;
}